

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::cpp::PrimitiveTypeName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,Options *options,CppType type)

{
  LogMessage *other;
  char *pcVar1;
  char *pcVar2;
  LogFinisher local_49;
  undefined1 local_48 [56];
  
  switch((int)options) {
  case 1:
    local_48._0_8_ = local_48 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"int32","");
    anon_unknown_0::IntTypeName
              (__return_storage_ptr__,(Options *)local_48._0_8_,(string *)local_48._8_8_);
    goto LAB_0023a29c;
  case 2:
    local_48._0_8_ = local_48 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"int64","");
    anon_unknown_0::IntTypeName
              (__return_storage_ptr__,(Options *)local_48._0_8_,(string *)local_48._8_8_);
    goto LAB_0023a29c;
  case 3:
    local_48._0_8_ = local_48 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"uint32","");
    anon_unknown_0::IntTypeName
              (__return_storage_ptr__,(Options *)local_48._0_8_,(string *)local_48._8_8_);
    goto LAB_0023a29c;
  case 4:
    local_48._0_8_ = local_48 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"uint64","");
    anon_unknown_0::IntTypeName
              (__return_storage_ptr__,(Options *)local_48._0_8_,(string *)local_48._8_8_);
LAB_0023a29c:
    if ((Options *)local_48._0_8_ == (Options *)(local_48 + 0x10)) {
      return __return_storage_ptr__;
    }
    operator_delete((void *)local_48._0_8_);
    return __return_storage_ptr__;
  case 5:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "double";
    pcVar1 = "";
    break;
  case 6:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "float";
    pcVar1 = "";
    break;
  case 7:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "bool";
    pcVar1 = "";
    break;
  case 8:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "int";
    pcVar1 = "";
    break;
  case 9:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "std::string";
    pcVar1 = "";
    break;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_helpers.cc"
               ,0x24f);
    other = internal::LogMessage::operator<<((LogMessage *)local_48,"Can\'t get here.");
    internal::LogFinisher::operator=(&local_49,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_48);
  case 10:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = "";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string PrimitiveTypeName(const Options& options,
                              FieldDescriptor::CppType type) {
  switch (type) {
    case FieldDescriptor::CPPTYPE_INT32:
      return IntTypeName(options, "int32");
    case FieldDescriptor::CPPTYPE_INT64:
      return IntTypeName(options, "int64");
    case FieldDescriptor::CPPTYPE_UINT32:
      return IntTypeName(options, "uint32");
    case FieldDescriptor::CPPTYPE_UINT64:
      return IntTypeName(options, "uint64");
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return "double";
    case FieldDescriptor::CPPTYPE_FLOAT:
      return "float";
    case FieldDescriptor::CPPTYPE_BOOL:
      return "bool";
    case FieldDescriptor::CPPTYPE_ENUM:
      return "int";
    case FieldDescriptor::CPPTYPE_STRING:
      return "std::string";
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return "";

      // No default because we want the compiler to complain if any new
      // CppTypes are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return "";
}